

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wsi.c
# Opt level: O2

void lws_role_transition(lws *wsi,lwsi_role role,lwsi_state state,lws_role_ops *ops)

{
  char *pcVar1;
  
  wsi->wsistate = role | state;
  if (ops == (lws_role_ops *)0x0) {
    ops = wsi->role_ops;
    if (ops == (lws_role_ops *)0x0) {
      pcVar1 = "(unset)";
      goto LAB_00115d9d;
    }
  }
  else {
    wsi->role_ops = ops;
  }
  pcVar1 = ops->name;
LAB_00115d9d:
  _lws_log(0x10,"%s: %p: wsistate 0x%lx, ops %s\n","lws_role_transition",wsi,(ulong)(role | state),
           pcVar1);
  return;
}

Assistant:

void
lws_role_transition(struct lws *wsi, enum lwsi_role role, enum lwsi_state state,
		    const struct lws_role_ops *ops)
{
#if defined(_DEBUG)
	const char *name = "(unset)";
#endif
	wsi->wsistate = role | state;
	if (ops)
		wsi->role_ops = ops;
#if defined(_DEBUG)
	if (wsi->role_ops)
		name = wsi->role_ops->name;
	lwsl_debug("%s: %p: wsistate 0x%lx, ops %s\n", __func__, wsi,
		   (unsigned long)wsi->wsistate, name);
#endif
}